

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

void * debug_realloc(void *ud,void *b,size_t oldsize,size_t size)

{
  char *__nptr;
  size_t *psVar1;
  size_t local_88;
  size_t local_80;
  ulong local_78;
  size_t realsize;
  size_t commonsize;
  int i;
  Header_conflict *newblock;
  char *limit;
  Header_conflict *pHStack_40;
  int type;
  Header_conflict *block;
  Memcontrol *mc;
  size_t size_local;
  size_t oldsize_local;
  void *b_local;
  void *ud_local;
  
  if (*(long *)((long)ud + 0x18) == 0) {
    __nptr = getenv("MEMLIMIT");
    if (__nptr == (char *)0x0) {
      local_78 = 0xffffffffffffffff;
    }
    else {
      local_78 = strtoul(__nptr,(char **)0x0,10);
    }
    *(ulong *)((long)ud + 0x18) = local_78;
  }
  if (b == (void *)0x0) {
    local_80 = oldsize;
    if (8 < oldsize) {
      local_80 = 0;
    }
    limit._4_4_ = (int)local_80;
    size_local = 0;
    pHStack_40 = (Header_conflict *)0x0;
  }
  else {
    pHStack_40 = (Header_conflict *)((long)b + -0x10);
    limit._4_4_ = *(int *)((long)b + -8);
    size_local = oldsize;
    if (oldsize != (pHStack_40->d).size) {
      __assert_fail("oldsize == block->d.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x8f,"void *debug_realloc(void *, void *, size_t, size_t)");
    }
  }
  if (size == 0) {
    freeblock((Memcontrol *)ud,pHStack_40);
    ud_local = (void *)0x0;
  }
  else {
    if ((*(long *)((long)ud + 0x20) != -1) && (size != size_local)) {
      if (*(long *)((long)ud + 0x20) == 0) {
        return (void *)0x0;
      }
      *(long *)((long)ud + 0x20) = *(long *)((long)ud + 0x20) + -1;
    }
    if ((size_local < size) &&
       (*(ulong *)((long)ud + 0x18) < (*(long *)((long)ud + 8) + size) - size_local)) {
      ud_local = (void *)0x0;
    }
    else {
      local_88 = size;
      if (size_local < size) {
        local_88 = size_local;
      }
      if (size + 0x20 < size) {
        ud_local = (void *)0x0;
      }
      else {
        psVar1 = (size_t *)malloc(size + 0x20);
        if (psVar1 == (size_t *)0x0) {
          ud_local = (void *)0x0;
        }
        else {
          if (pHStack_40 != (Header_conflict *)0x0) {
            memcpy(psVar1 + 2,pHStack_40 + 1,local_88);
            freeblock((Memcontrol *)ud,pHStack_40);
          }
          memset((void *)((long)psVar1 + local_88 + 0x10),0xab,size - local_88);
          for (commonsize._4_4_ = 0; commonsize._4_4_ < 0x10;
              commonsize._4_4_ = commonsize._4_4_ + 1) {
            *(undefined1 *)((long)psVar1 + (long)commonsize._4_4_ + size + 0x10) = 0x55;
          }
          *psVar1 = size;
          *(int *)(psVar1 + 1) = limit._4_4_;
          *(size_t *)((long)ud + 8) = size + *(long *)((long)ud + 8);
          if (*(ulong *)((long)ud + 0x10) < *(ulong *)((long)ud + 8)) {
            *(undefined8 *)((long)ud + 0x10) = *(undefined8 *)((long)ud + 8);
          }
          *(long *)ud = *ud + 1;
          *(long *)((long)ud + (long)limit._4_4_ * 8 + 0x28) =
               *(long *)((long)ud + (long)limit._4_4_ * 8 + 0x28) + 1;
          ud_local = psVar1 + 2;
        }
      }
    }
  }
  return ud_local;
}

Assistant:

LUA_API void *debug_realloc (void *ud, void *b, size_t oldsize, size_t size) {
  Memcontrol *mc = cast(Memcontrol *, ud);
  Header *block = cast(Header *, b);
  int type;
  if (mc->memlimit == 0) {  /* first time? */
    char *limit = getenv("MEMLIMIT");  /* initialize memory limit */
    mc->memlimit = limit ? strtoul(limit, NULL, 10) : ULONG_MAX;
  }
  if (block == NULL) {
    type = (oldsize < LUA_NUMTAGS) ? oldsize : 0;
    oldsize = 0;
  }
  else {
    block--;  /* go to real header */
    type = block->d.type;
    lua_assert(oldsize == block->d.size);
  }
  if (size == 0) {
    freeblock(mc, block);
    return NULL;
  }
  if (mc->countlimit != ~0UL && size != oldsize) {  /* count limit in use? */
    if (mc->countlimit == 0)
      return NULL;  /* fake a memory allocation error */
    mc->countlimit--;
  }
  if (size > oldsize && mc->total+size-oldsize > mc->memlimit)
    return NULL;  /* fake a memory allocation error */
  else {
    Header *newblock;
    int i;
    size_t commonsize = (oldsize < size) ? oldsize : size;
    size_t realsize = sizeof(Header) + size + MARKSIZE;
    if (realsize < size) return NULL;  /* arithmetic overflow! */
    newblock = cast(Header *, malloc(realsize));  /* alloc a new block */
    if (newblock == NULL)
      return NULL;  /* really out of memory? */
    if (block) {
      memcpy(newblock + 1, block + 1, commonsize);  /* copy old contents */
      freeblock(mc, block);  /* erase (and check) old copy */
    }
    /* initialize new part of the block with something weird */
    fillmem(cast_charp(newblock + 1) + commonsize, size - commonsize);
    /* initialize marks after block */
    for (i = 0; i < MARKSIZE; i++)
      *(cast_charp(newblock + 1) + size + i) = MARK;
    newblock->d.size = size;
    newblock->d.type = type;
    mc->total += size;
    if (mc->total > mc->maxmem)
      mc->maxmem = mc->total;
    mc->numblocks++;
    mc->objcount[type]++;
    return newblock + 1;
  }
}